

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

stumpless_target * stumpless_set_target_default_msgid(stumpless_target *target,char *msgid)

{
  _Bool _Var1;
  char *message;
  size_t new_length;
  size_t local_20;
  
  if (target == (stumpless_target *)0x0) {
    message = "target was NULL";
  }
  else {
    if (msgid != (char *)0x0) {
      _Var1 = validate_msgid(msgid,&local_20);
      if (!_Var1) {
        return (stumpless_target *)0x0;
      }
      clear_error();
      pthread_lock_mutex((pthread_mutex_t *)target->mutex);
      memcpy(target->default_msgid,msgid,local_20);
      target->default_msgid_length = local_20;
      pthread_unlock_mutex((pthread_mutex_t *)target->mutex);
      return target;
    }
    message = "msgid was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_set_target_default_msgid( struct stumpless_target *target,
                                    const char *msgid ) {
  size_t new_length;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( msgid );

  if( unlikely( !validate_msgid( msgid, &new_length ) ) ) {
    return NULL;
  }

  clear_error(  );

  lock_target( target );
  memcpy( target->default_msgid, msgid, new_length );
  target->default_msgid_length = new_length;
  unlock_target( target );

  return target;
}